

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

void __thiscall flatbuffers::Parser::Message(Parser *this,string *msg)

{
  size_type *psVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  int64_t t;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  string local_a8;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  string local_68;
  string local_48;
  
  psVar2 = &this->error_;
  if ((this->error_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar2);
  }
  if ((this->file_being_parsed_)._M_string_length == 0) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  }
  else {
    AbsolutePath(&local_a8,&this->file_being_parsed_);
  }
  std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_a8._M_dataplus._M_p);
  paVar3 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((this->file_being_parsed_)._M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar2);
  }
  NumToString<int>(&local_48,(this->super_ParserState).line_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_78 = *puVar6;
    lStack_70 = plVar4[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar6;
    local_88 = (ulong *)*plVar4;
  }
  local_80 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  t = ParserState::CursorPosition(&this->super_ParserState);
  NumToString<long>(&local_68,t);
  uVar7 = 0xf;
  if (local_88 != &local_78) {
    uVar7 = local_78;
  }
  if (uVar7 < local_68._M_string_length + local_80) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar8 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_80 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_00104c01;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
LAB_00104c01:
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_a8.field_2._M_allocated_capacity = *psVar1;
    local_a8.field_2._8_8_ = puVar5[3];
    local_a8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar1;
    local_a8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_a8._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_a8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_a8,": ",msg);
  std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_a8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Parser::Message(const std::string &msg) {
  if (!error_.empty()) error_ += "\n";  // log all warnings and errors
  error_ += file_being_parsed_.length() ? AbsolutePath(file_being_parsed_) : "";
  // clang-format off

  #ifdef _WIN32  // MSVC alike
    error_ +=
        "(" + NumToString(line_) + ", " + NumToString(CursorPosition()) + ")";
  #else  // gcc alike
    if (file_being_parsed_.length()) error_ += ":";
    error_ += NumToString(line_) + ": " + NumToString(CursorPosition());
  #endif
  // clang-format on
  error_ += ": " + msg;
}